

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.h
# Opt level: O2

void __thiscall aiMesh::aiMesh(aiMesh *this)

{
  char *pcVar1;
  uint a;
  long lVar2;
  
  this->mPrimitiveTypes = 0;
  this->mNumVertices = 0;
  this->mNumFaces = 0;
  memset(&this->mVertices,0,0xcc);
  this->mBones = (aiBone **)0x0;
  this->mMaterialIndex = 0;
  (this->mName).length = 0;
  (this->mName).data[0] = '\0';
  memset((this->mName).data + 1,0x1b,0x3ff);
  this->mNumAnimMeshes = 0;
  this->mAnimMeshes = (aiAnimMesh **)0x0;
  this->mMethod = 0;
  (this->mAABB).mMin.x = 0.0;
  (this->mAABB).mMin.y = 0.0;
  (this->mAABB).mMin.z = 0.0;
  (this->mAABB).mMax.x = 0.0;
  (this->mAABB).mMax.y = 0.0;
  (this->mAABB).mMax.z = 0.0;
  for (lVar2 = -0x20; lVar2 != 0; lVar2 = lVar2 + 4) {
    pcVar1 = (this->mName).data + lVar2 + -0x20;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    *(undefined8 *)((long)this->mNumUVComponents + lVar2 * 2) = 0;
  }
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    this->mColors[lVar2] = (aiColor4D *)0x0;
  }
  return;
}

Assistant:

aiMesh() AI_NO_EXCEPT
    : mPrimitiveTypes( 0 )
    , mNumVertices( 0 )
    , mNumFaces( 0 )
    , mVertices( nullptr )
    , mNormals(nullptr)
    , mTangents(nullptr)
    , mBitangents(nullptr)
    , mColors()
    , mTextureCoords()
    , mNumUVComponents()
    , mFaces(nullptr)
    , mNumBones( 0 )
    , mBones(nullptr)
    , mMaterialIndex( 0 )
    , mNumAnimMeshes( 0 )
    , mAnimMeshes(nullptr)
    , mMethod( 0 )
    , mAABB() {
        for( unsigned int a = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++a ) {
            mNumUVComponents[a] = 0;
            mTextureCoords[a] = nullptr;
        }

        for (unsigned int a = 0; a < AI_MAX_NUMBER_OF_COLOR_SETS; ++a) {
            mColors[a] = nullptr;
        }
    }